

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_translate.cpp
# Opt level: O1

void __thiscall FRemapTable::Free(FRemapTable *this)

{
  if (this->Native != (FNativePalette *)0x0) {
    (*this->Native->_vptr_FNativePalette[1])();
    this->Native = (FNativePalette *)0x0;
  }
  if (this->Remap != (BYTE *)0x0) {
    M_Free(this->Remap);
    this->NumEntries = 0;
    this->Remap = (BYTE *)0x0;
    this->Palette = (PalEntry *)0x0;
  }
  return;
}

Assistant:

void FRemapTable::Free()
{
	KillNative();
	if (Remap != NULL)
	{
		M_Free(Remap);
		Remap = NULL;
		Palette = NULL;
		NumEntries = 0;
	}
}